

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRoundItem.h
# Opt level: O3

void __thiscall
TimeRoundItem<channel>::TimeRoundItem
          (TimeRoundItem<channel> *this,int _time_threod,Fun *_fun,shared_ptr<channel> *_ptr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->time_threod = _time_threod;
  std::function<void_()>::function(&this->fun,_fun);
  (this->ptr).super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_ptr->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (_ptr->super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->ptr).super___shared_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->index = 0;
  return;
}

Assistant:

TimeRoundItem(int _time_threod,Fun _fun,std::shared_ptr<T> _ptr):
        time_threod(_time_threod),fun(_fun),ptr(_ptr)
        {
            index = 0;
        }